

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

int64 TTD::NSLogEvents::AccessTimeInRootCallOrSnapshot
                (EventLogEntry *evt,bool *isSnap,bool *isRoot,bool *hasRtrSnap)

{
  bool bVar1;
  SnapshotEventLogEntry *pSVar2;
  JsRTCallFunctionAction *pJVar3;
  bool local_41;
  JsRTCallFunctionAction *rootEntry;
  SnapshotEventLogEntry *snapEvent;
  bool *hasRtrSnap_local;
  bool *isRoot_local;
  bool *isSnap_local;
  EventLogEntry *evt_local;
  
  *isSnap = false;
  *isRoot = false;
  *hasRtrSnap = false;
  if (evt->EventKind == SnapshotTag) {
    pSVar2 = GetInlineEventDataAs<TTD::NSLogEvents::SnapshotEventLogEntry,(TTD::NSLogEvents::EventKind)1>
                       (evt);
    *isSnap = true;
    evt_local = (EventLogEntry *)pSVar2->RestoreTimestamp;
  }
  else {
    bVar1 = IsJsRTActionRootCall(evt);
    if (bVar1) {
      pJVar3 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                         (evt);
      *isRoot = true;
      local_41 = false;
      if (pJVar3->AdditionalReplayInfo != (JsRTCallFunctionAction_ReplayAdditionalInfo *)0x0) {
        local_41 = pJVar3->AdditionalReplayInfo->RtRSnap != (SnapShot *)0x0;
      }
      *hasRtrSnap = local_41;
      evt_local = (EventLogEntry *)pJVar3->CallEventTime;
    }
    else {
      evt_local = (EventLogEntry *)&DAT_ffffffffffffffff;
    }
  }
  return (int64)evt_local;
}

Assistant:

int64 AccessTimeInRootCallOrSnapshot(const EventLogEntry* evt, bool& isSnap, bool& isRoot, bool& hasRtrSnap)
        {
            isSnap = false;
            isRoot = false;
            hasRtrSnap = false;

            if(evt->EventKind == NSLogEvents::EventKind::SnapshotTag)
            {
                const NSLogEvents::SnapshotEventLogEntry* snapEvent = NSLogEvents::GetInlineEventDataAs<NSLogEvents::SnapshotEventLogEntry, NSLogEvents::EventKind::SnapshotTag>(evt);

                isSnap = true;
                return snapEvent->RestoreTimestamp;
            }
            else if(NSLogEvents::IsJsRTActionRootCall(evt))
            {
                const NSLogEvents::JsRTCallFunctionAction* rootEntry = NSLogEvents::GetInlineEventDataAs<NSLogEvents::JsRTCallFunctionAction, NSLogEvents::EventKind::CallExistingFunctionActionTag>(evt);

                isRoot = true;
                hasRtrSnap = (rootEntry->AdditionalReplayInfo != nullptr && rootEntry->AdditionalReplayInfo->RtRSnap != nullptr);
                return rootEntry->CallEventTime;
            }
            else
            {
                return -1;
            }
        }